

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.hpp
# Opt level: O2

IPalObject ** CorUnix::InternalNewArray<CorUnix::IPalObject*>(size_t cElements)

{
  size_t *psVar1;
  IPalObject **ppIVar2;
  
  psVar1 = (size_t *)InternalMalloc(cElements * 8 + 8);
  if (psVar1 != (size_t *)0x0) {
    *psVar1 = cElements;
    ppIVar2 = (IPalObject **)memset(psVar1 + 1,0,-(ulong)(cElements >> 0x3d != 0) | cElements * 8);
    return ppIVar2;
  }
  return (IPalObject **)0x0;
}

Assistant:

T* InternalNewArray(size_t cElements)
    {
        size_t cbSize = (cElements * sizeof(T)) + sizeof(size_t);
        T *pMem;

        pMem = (T*)InternalMalloc(cbSize);

        if (pMem == NULL)
            return NULL;

        *(size_t*)pMem = cElements;
        pMem = (T*)((size_t*)pMem + 1);

        return new (pMem) T[cElements]();
    }